

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::dequantize_from_int32(Mat *src,Mat *dst,Mat *scale_data,Mat *bias_data,Option *opt)

{
  Layer *pLVar1;
  long lVar2;
  ParamDict pd;
  ModelBinFromMatArray local_d8;
  Mat weights [2];
  
  pLVar1 = create_layer(0x3a);
  ParamDict::ParamDict(&pd);
  ParamDict::set(&pd,0,scale_data->w);
  ParamDict::set(&pd,1,bias_data->w);
  (*pLVar1->_vptr_Layer[2])(pLVar1,&pd);
  weights[0].elemsize._0_4_ = 0;
  weights[0]._20_8_ = 0;
  weights[0].data = (void *)0x0;
  weights[0].refcount._0_4_ = 0;
  weights[0].refcount._4_4_ = 0;
  weights[0].allocator = (Allocator *)0x0;
  weights[0].dims = 0;
  weights[0].w = 0;
  weights[0].h = 0;
  weights[0].d = 0;
  weights[0].c = 0;
  weights[1].cstep = 0;
  weights[1].allocator = (Allocator *)0x0;
  weights[1].dims = 0;
  weights[1].w = 0;
  weights[1].h = 0;
  weights[1].d = 0;
  weights[1].c = 0;
  weights[0].cstep = 0;
  weights[1].data = (void *)0x0;
  weights[1].refcount = (int *)0x0;
  weights[1].elemsize = 0;
  weights[1].elempack = 0;
  Mat::operator=(weights,scale_data);
  Mat::operator=(weights + 1,bias_data);
  ModelBinFromMatArray::ModelBinFromMatArray(&local_d8,weights);
  (*pLVar1->_vptr_Layer[3])(pLVar1,&local_d8);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_d8);
  (*pLVar1->_vptr_Layer[4])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[7])(pLVar1,src,dst,opt);
  (*pLVar1->_vptr_Layer[5])(pLVar1,opt);
  (*pLVar1->_vptr_Layer[1])(pLVar1);
  lVar2 = 0x48;
  do {
    Mat::~Mat((Mat *)((long)&weights[0].data + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x48);
  ParamDict::~ParamDict(&pd);
  return;
}

Assistant:

void dequantize_from_int32(const Mat& src, Mat& dst, const Mat& scale_data, const Mat& bias_data, const Option& opt)
{
    Layer* dequantize = create_layer(LayerType::Dequantize);

    ParamDict pd;
    pd.set(0, scale_data.w);
    pd.set(1, bias_data.w);

    dequantize->load_param(pd);

    Mat weights[2];
    weights[0] = scale_data;
    weights[1] = bias_data;

    dequantize->load_model(ModelBinFromMatArray(weights));

    dequantize->create_pipeline(opt);

    dequantize->forward(src, dst, opt);

    dequantize->destroy_pipeline(opt);

    delete dequantize;
}